

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::fan_reduce_tmpl<Omega_h::SumFunctor<long>>
          (Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width)

{
  int iVar1;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Write<long> local_f8;
  undefined1 local_e8 [8];
  type f;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  Write<signed_char> a_data;
  int na;
  Int width_local;
  Read<signed_char> *b_data_local;
  LOs *a2b_local;
  ulong local_20;
  ulong local_10;
  
  a_data.shared_alloc_.direct_ptr._4_4_ = width;
  iVar1 = Read<int>::last(a2b);
  if (((ulong)(b_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b_data->write_).shared_alloc_.alloc >> 3;
  }
  if (iVar1 * a_data.shared_alloc_.direct_ptr._4_4_ == (int)(local_20 >> 3)) {
    if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
    }
    a_data.shared_alloc_.direct_ptr._0_4_ = (int)(local_10 >> 2) + -1;
    iVar1 = (int)a_data.shared_alloc_.direct_ptr * a_data.shared_alloc_.direct_ptr._4_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    Write<long>::Write((Write<long> *)local_78,iVar1,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    local_e8._0_4_ = a_data.shared_alloc_.direct_ptr._4_4_;
    Read<int>::Read((Read<int> *)&f,a2b);
    Read<long>::Read((Read<long> *)&f.a2b.write_.shared_alloc_.direct_ptr,(Read<int> *)b_data);
    Write<long>::Write((Write<long> *)&f.b_data.write_.shared_alloc_.direct_ptr,
                       (Write<int> *)local_78);
    parallel_for<Omega_h::fan_reduce_tmpl<Omega_h::SumFunctor<long>>(Omega_h::Read<int>,Omega_h::Read<Omega_h::SumFunctor<long>::input_type>,int)::_lambda(int)_1_>
              ((int)a_data.shared_alloc_.direct_ptr,(type *)local_e8,"fan_reduce");
    Write<long>::Write(&local_f8,(Write<int> *)local_78);
    Read<long>::Read((Read<long> *)this,&local_f8);
    Write<long>::~Write(&local_f8);
    fan_reduce_tmpl<Omega_h::SumFunctor<long>>(Omega_h::Read<int>,Omega_h::Read<Omega_h::SumFunctor<long>::input_type>,int)
    ::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_e8);
    Write<long>::~Write((Write<long> *)local_78);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a2b.last() * width == b_data.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x127);
}

Assistant:

Read<typename Functor::input_type> fan_reduce_tmpl(
    LOs a2b, Read<typename Functor::input_type> b_data, Int width) {
  using T = typename Functor::input_type;
  using VT = typename Functor::value_type;
  OMEGA_H_CHECK(a2b.last() * width == b_data.size());
  auto na = a2b.size() - 1;
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto functor = Functor();
    for (Int j = 0; j < width; ++j) {
      VT res;
      functor.init(res);
      for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
        VT update = b_data[b * width + j];
        functor.join(res, update);
      }
      a_data[a * width + j] = static_cast<T>(res);
    }
  };
  parallel_for(na, f, "fan_reduce");
  return a_data;
}